

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.h
# Opt level: O3

int aom_get_qmlevel_444_chroma(int qindex,int first,int last)

{
  int iVar1;
  
  iVar1 = 10;
  if ((((0xc < qindex) && (iVar1 = 9, 0x18 < (uint)qindex)) && (iVar1 = 8, 0x20 < (uint)qindex)) &&
     (((iVar1 = 7, 0x24 < (uint)qindex && (iVar1 = 6, 0x2c < (uint)qindex)) &&
      ((iVar1 = 5, 0x30 < (uint)qindex && (iVar1 = 4, 0x38 < (uint)qindex)))))) {
    iVar1 = ((uint)qindex < 0x59) + 2;
  }
  if (iVar1 < last) {
    last = iVar1;
  }
  if (iVar1 < first) {
    last = first;
  }
  return last;
}

Assistant:

static inline int aom_get_qmlevel_444_chroma(int qindex, int first, int last) {
  int chroma_qm_level = 0;

  if (qindex <= 12) {
    chroma_qm_level = 10;
  } else if (qindex <= 24) {
    chroma_qm_level = 9;
  } else if (qindex <= 32) {
    chroma_qm_level = 8;
  } else if (qindex <= 36) {
    chroma_qm_level = 7;
  } else if (qindex <= 44) {
    chroma_qm_level = 6;
  } else if (qindex <= 48) {
    chroma_qm_level = 5;
  } else if (qindex <= 56) {
    chroma_qm_level = 4;
  } else if (qindex <= 88) {
    chroma_qm_level = 3;
  } else {
    chroma_qm_level = 2;
  }

  return clamp(chroma_qm_level, first, last);
}